

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# paramdict.cpp
# Opt level: O2

FloatTextureHandle __thiscall
pbrt::TextureParameterDictionary::GetFloatTexture
          (TextureParameterDictionary *this,string *name,Float defaultValue,Allocator alloc)

{
  uintptr_t iptr;
  Float *pFVar1;
  long *in_RCX;
  FloatTextureHandle tex;
  
  GetFloatTextureOrNull((TextureParameterDictionary *)&tex,name,alloc);
  if (((ulong)tex.
              super_TaggedPointer<pbrt::FloatImageTexture,_pbrt::GPUFloatImageTexture,_pbrt::FloatMixTexture,_pbrt::FloatScaledTexture,_pbrt::FloatConstantTexture,_pbrt::FloatBilerpTexture,_pbrt::FloatCheckerboardTexture,_pbrt::FloatDotsTexture,_pbrt::FBmTexture,_pbrt::FloatPtexTexture,_pbrt::WindyTexture,_pbrt::WrinkledTexture>
              .bits & 0xffffffffffff) == 0) {
    pFVar1 = (Float *)(**(code **)(*in_RCX + 0x10))();
    tex.
    super_TaggedPointer<pbrt::FloatImageTexture,_pbrt::GPUFloatImageTexture,_pbrt::FloatMixTexture,_pbrt::FloatScaledTexture,_pbrt::FloatConstantTexture,_pbrt::FloatBilerpTexture,_pbrt::FloatCheckerboardTexture,_pbrt::FloatDotsTexture,_pbrt::FBmTexture,_pbrt::FloatPtexTexture,_pbrt::WindyTexture,_pbrt::WrinkledTexture>
    .bits = (TaggedPointer<pbrt::FloatImageTexture,_pbrt::GPUFloatImageTexture,_pbrt::FloatMixTexture,_pbrt::FloatScaledTexture,_pbrt::FloatConstantTexture,_pbrt::FloatBilerpTexture,_pbrt::FloatCheckerboardTexture,_pbrt::FloatDotsTexture,_pbrt::FBmTexture,_pbrt::FloatPtexTexture,_pbrt::WindyTexture,_pbrt::WrinkledTexture>
             )((ulong)pFVar1 | 0x5000000000000);
    *pFVar1 = defaultValue;
  }
  this->dict = (ParameterDictionary *)
               tex.
               super_TaggedPointer<pbrt::FloatImageTexture,_pbrt::GPUFloatImageTexture,_pbrt::FloatMixTexture,_pbrt::FloatScaledTexture,_pbrt::FloatConstantTexture,_pbrt::FloatBilerpTexture,_pbrt::FloatCheckerboardTexture,_pbrt::FloatDotsTexture,_pbrt::FBmTexture,_pbrt::FloatPtexTexture,_pbrt::WindyTexture,_pbrt::WrinkledTexture>
               .bits;
  return (FloatTextureHandle)
         (TaggedPointer<pbrt::FloatImageTexture,_pbrt::GPUFloatImageTexture,_pbrt::FloatMixTexture,_pbrt::FloatScaledTexture,_pbrt::FloatConstantTexture,_pbrt::FloatBilerpTexture,_pbrt::FloatCheckerboardTexture,_pbrt::FloatDotsTexture,_pbrt::FBmTexture,_pbrt::FloatPtexTexture,_pbrt::WindyTexture,_pbrt::WrinkledTexture>
          )this;
}

Assistant:

FloatTextureHandle TextureParameterDictionary::GetFloatTexture(const std::string &name,
                                                               Float defaultValue,
                                                               Allocator alloc) const {
    FloatTextureHandle tex = GetFloatTextureOrNull(name, alloc);
    return tex ? tex : alloc.new_object<FloatConstantTexture>(defaultValue);
}